

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_Value.h
# Opt level: O0

void __thiscall choc::value::ValueView::ValueView(ValueView *this,ValueView *param_1)

{
  ValueView *param_1_local;
  ValueView *this_local;
  
  Type::Type(&this->type,&param_1->type);
  this->data = param_1->data;
  this->stringDictionary = param_1->stringDictionary;
  return;
}

Assistant:

ValueView (const ValueView&) = default;